

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda.c
# Opt level: O2

void feat_lda_transform(feat_t *fcb,mfcc_t ***inout_feat,uint32 nfr)

{
  uint uVar1;
  uint uVar2;
  void *ptr;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  ptr = __ckd_calloc__((ulong)*fcb->stream_len,4,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/lda.c"
                       ,0x90);
  for (uVar5 = 0; uVar5 != nfr; uVar5 = uVar5 + 1) {
    memset(ptr,0,(ulong)*fcb->stream_len << 2);
    uVar1 = fcb->out_dim;
    for (uVar3 = 0; uVar3 != uVar1; uVar3 = uVar3 + 1) {
      uVar2 = *fcb->stream_len;
      for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
        *(float *)((long)ptr + uVar3 * 4) =
             (float)(*inout_feat[uVar5])[uVar4] * (float)(*fcb->lda)[uVar3][uVar4] +
             *(float *)((long)ptr + uVar3 * 4);
      }
    }
    memcpy(*inout_feat[uVar5],ptr,(ulong)*fcb->stream_len << 2);
  }
  ckd_free(ptr);
  return;
}

Assistant:

void
feat_lda_transform(feat_t *fcb, mfcc_t ***inout_feat, uint32 nfr)
{
    mfcc_t *tmp;
    uint32 i, j, k;

    tmp = ckd_calloc(fcb->stream_len[0], sizeof(mfcc_t));
    for (i = 0; i < nfr; ++i) {
        /* Do the matrix multiplication inline here since fcb->lda
         * is transposed (eigenvectors in rows not columns). */
        /* FIXME: In the future we ought to use the BLAS. */
        memset(tmp, 0, sizeof(mfcc_t) * fcb->stream_len[0]);
        for (j = 0; j < feat_dimension(fcb); ++j) {
            for (k = 0; k < fcb->stream_len[0]; ++k) {
                tmp[j] += MFCCMUL(inout_feat[i][0][k], fcb->lda[0][j][k]);
            }
        }
        memcpy(inout_feat[i][0], tmp, fcb->stream_len[0] * sizeof(mfcc_t));
    }
    ckd_free(tmp);
}